

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall QCborStreamReaderPrivate::~QCborStreamReaderPrivate(QCborStreamReaderPrivate *this)

{
  QArrayDataPointer<CborValue>::~QArrayDataPointer
            ((QArrayDataPointer<CborValue> *)&this->containerStack);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->buffer).d);
  return;
}

Assistant:

~QCborStreamReaderPrivate()
    {
    }